

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

void __thiscall Peeps::SetReg(Peeps *this,RegNum reg,StackSym *sym)

{
  ClearReg(this,reg);
  if ((sym->field_0x1b & 0x10) == 0) {
    ClearReg(this,(sym->scratch).peeps.reg);
    this->regMap[reg] = sym;
    (sym->scratch).peeps.reg = reg;
  }
  return;
}

Assistant:

void
Peeps::SetReg(RegNum reg, StackSym *sym)
{
    this->ClearReg(reg);

    if (sym->m_isClosureSym)
    {
        return;
    }

    this->ClearReg(sym->scratch.peeps.reg);
    this->regMap[reg] = sym;
    sym->scratch.peeps.reg = reg;
}